

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

ImVec2 ImBezierCubicCalc(ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImVec2 *p4,float t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImVec2 IVar5;
  
  fVar4 = 1.0 - t;
  fVar1 = fVar4 * fVar4 * fVar4;
  fVar2 = fVar4 * fVar4 * 3.0 * t;
  fVar4 = fVar4 * 3.0 * t * t;
  fVar3 = t * t * t;
  IVar5.x = fVar3 * (*p4).x + fVar4 * (*p3).x + fVar1 * (*p1).x + fVar2 * (*p2).x;
  IVar5.y = fVar3 * (*p4).y + fVar4 * (*p3).y + fVar1 * (*p1).y + fVar2 * (*p2).y;
  return IVar5;
}

Assistant:

ImVec2 ImBezierCubicCalc(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, const ImVec2& p4, float t)
{
    float u = 1.0f - t;
    float w1 = u * u * u;
    float w2 = 3 * u * u * t;
    float w3 = 3 * u * t * t;
    float w4 = t * t * t;
    return ImVec2(w1 * p1.x + w2 * p2.x + w3 * p3.x + w4 * p4.x, w1 * p1.y + w2 * p2.y + w3 * p3.y + w4 * p4.y);
}